

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::
CBufferIndirectDrawElementsOffset<glcts::(anonymous_namespace)::test_api::ES3>::Cleanup
          (CBufferIndirectDrawElementsOffset<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->_program);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->_vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_ebo);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_bufferIndirect);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisableVertexAttribArray(0);
		glUseProgram(0);
		glDeleteProgram(_program);
		glDeleteVertexArrays(1, &_vao);
		glDeleteBuffers(1, &_buffer);
		glDeleteBuffers(1, &_ebo);
		glDeleteBuffers(1, &_bufferIndirect);
		return NO_ERROR;
	}